

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListFile.cpp
# Opt level: O1

size_t ListFile_GetNext(void *pvListFile,char *szMask,char *szBuffer,size_t nMaxChars)

{
  bool bVar1;
  size_t sVar2;
  size_t nLength;
  DWORD dwErrCode;
  
  do {
    sVar2 = ListFile_GetNextLine(pvListFile,szBuffer,nMaxChars);
    if (sVar2 == 0) {
      dwErrCode = 0x3e9;
      goto LAB_0010f981;
    }
    bVar1 = CheckWildCard(szBuffer,szMask);
  } while (!bVar1);
  dwErrCode = 0;
LAB_0010f981:
  if (sVar2 == 0) {
    SetLastError(dwErrCode);
  }
  return sVar2;
}

Assistant:

size_t ListFile_GetNext(void * pvListFile, const char * szMask, char * szBuffer, size_t nMaxChars)
{
    size_t nLength = 0;
    int nError = ERROR_SUCCESS;

    // Check for parameters
    for(;;)
    {
        // Read the (next) line
        nLength = ListFile_GetNextLine(pvListFile, szBuffer, nMaxChars);
        if(nLength == 0)
        {
            nError = ERROR_NO_MORE_FILES;
            break;
        }

        // If some mask entered, check it
        if(CheckWildCard(szBuffer, szMask))
        {
            nError = ERROR_SUCCESS;
            break;
        }
    }

    if(nError != ERROR_SUCCESS)
        SetLastError(nError);
    return nLength;
}